

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fct_logger_i * fckern_sel_log(fct_logger_types_t *search,char *sel_logger)

{
  int iVar1;
  size_t sVar2;
  fct_logger_i *pfVar3;
  fct_logger_types_t *local_28;
  fct_logger_types_t *iter;
  char *sel_logger_local;
  fct_logger_types_t *search_local;
  
  if (search == (fct_logger_types_t *)0x0) {
    __assert_fail("search != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x81b
                  ,"fct_logger_i *fckern_sel_log(fct_logger_types_t *, const char *)");
  }
  if (sel_logger != (char *)0x0) {
    sVar2 = strlen(sel_logger);
    local_28 = search;
    if (sVar2 == 0) {
      __assert_fail("strlen(sel_logger) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x81d,"fct_logger_i *fckern_sel_log(fct_logger_types_t *, const char *)");
    }
    while( true ) {
      if (local_28->name == (char *)0x0) {
        return (fct_logger_i *)0x0;
      }
      iVar1 = fctstr_ieq(local_28->name,sel_logger);
      if (iVar1 != 0) break;
      local_28 = local_28 + 1;
    }
    pfVar3 = (*local_28->logger_new_fn)();
    return pfVar3;
  }
  __assert_fail("sel_logger != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x81c,
                "fct_logger_i *fckern_sel_log(fct_logger_types_t *, const char *)");
}

Assistant:

static fct_logger_i*
fckern_sel_log(fct_logger_types_t *search, char const *sel_logger)
{
    fct_logger_types_t *iter;
    FCT_ASSERT(search != NULL);
    FCT_ASSERT(sel_logger != NULL);
    FCT_ASSERT(strlen(sel_logger) > 0);
    for ( iter = search; iter->name != NULL; ++iter)
    {
        if ( fctstr_ieq(iter->name, sel_logger) )
        {
            return iter->logger_new_fn();
        }
    }
    return NULL;
}